

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

int CmdCommandHelp(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint fDetails;
  uint fPrintAll;
  char *pcVar3;
  
  fPrintAll = 0;
  Extra_UtilGetoptReset();
  fDetails = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"adh"), iVar1 == 100) {
      fDetails = fDetails ^ 1;
    }
    if (iVar1 == -1) break;
    if ((iVar1 != 0x76) && (iVar1 != 0x61)) goto LAB_002bacbd;
    fPrintAll = fPrintAll ^ 1;
  }
  if (globalUtilOptind == argc) {
    CmdCommandPrint(pAbc,fPrintAll,fDetails);
    return 0;
  }
LAB_002bacbd:
  fwrite("usage: help [-a] [-d] [-h]\n",0x1b,1,(FILE *)pAbc->Err);
  fwrite("       prints the list of available commands by group\n",0x36,1,(FILE *)pAbc->Err);
  pcVar3 = "yes";
  pcVar2 = "yes";
  if (fPrintAll == 0) {
    pcVar2 = "no";
  }
  fprintf((FILE *)pAbc->Err," -a       toggle printing hidden commands [default = %s]\n",pcVar2);
  if (fDetails == 0) {
    pcVar3 = "no";
  }
  fprintf((FILE *)pAbc->Err," -d       print usage details to all commands [default = %s]\n",pcVar3)
  ;
  fwrite(" -h       print the command usage\n",0x22,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int CmdCommandHelp( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int fPrintAll, fDetails;
    int c;

    fPrintAll = 0;
    fDetails = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "adh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            case 'v':
                fPrintAll ^= 1;
                break;
            break;
        case 'd':
            fDetails ^= 1;
            break;
        case 'h':
            goto usage;
            break;
        default:
            goto usage;
        }
    }

    if ( argc != globalUtilOptind )
        goto usage;

    CmdCommandPrint( pAbc, fPrintAll, fDetails );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: help [-a] [-d] [-h]\n" );
    fprintf( pAbc->Err, "       prints the list of available commands by group\n" );
    fprintf( pAbc->Err, " -a       toggle printing hidden commands [default = %s]\n", fPrintAll? "yes": "no" );
    fprintf( pAbc->Err, " -d       print usage details to all commands [default = %s]\n", fDetails? "yes": "no" );
    fprintf( pAbc->Err, " -h       print the command usage\n" );
    return 1;
}